

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_array_nested_assoc_array(void)

{
  bool v;
  char *pcVar1;
  uchar (*in_RDX) [14];
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_228;
  const_iterator local_208;
  const_iterator local_1f0;
  iterator local_1d8;
  iterator local_1c0;
  undefined1 local_1a1;
  nullable local_1a0 [2];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_198;
  basic_variable<std::allocator<char>_> *local_130;
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_98 [24];
  basic_variable<std::allocator<char>_> expected;
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  value_type input [14];
  
  result.storage._40_6_ = 0x4103a99e8192;
  result.storage._46_2_ = 0x4342;
  trial::protocol::bintoken::parse<unsigned_char[14],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,
             (bintoken *)&result.storage.field_0x28,in_RDX);
  v = trial::dynamic::basic_variable<std::allocator<char>>::
      is<trial::dynamic::basic_array<std::allocator<char>>>
                ((basic_variable<std::allocator<char>> *)local_48);
  pcVar1 = "void parser_suite::parse_array_nested_assoc_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x225,"void parser_suite::parse_array_nested_assoc_array()",v);
  local_1a1 = 1;
  local_130 = &local_128;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_130,true);
  local_1a0[1] = 0x7f;
  local_130 = &local_f8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_int,_true>(&local_198,(char (*) [4])"ABC",(int *)(local_1a0 + 1));
  trial::dynamic::basic_map<std::allocator<char>_>::make(&local_f8,&local_198);
  local_130 = &local_c8;
  local_1a0[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_130,local_1a0);
  local_1a1 = 0;
  local_98._0_8_ = &local_128;
  local_98._8_8_ = 3;
  init._M_len = (size_type)pcVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (basic_array<std::allocator<char>_> *)local_98._0_8_,init);
  local_228 = (basic_variable<std::allocator<char>_> *)local_98;
  do {
    local_228 = local_228 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_228);
  } while (local_228 != &local_128);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::~pair(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c0,(basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1d8,(basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1f0,(basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_208,(basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x229,"void parser_suite::parse_array_nested_assoc_array()",&local_1c0,&local_1d8,
             &local_1f0,&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_208)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_1f0)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void parse_array_nested_assoc_array()
{
    const value_type input[] = {
        bintoken::token::code::begin_array,
        bintoken::token::code::true_value,
        bintoken::token::code::begin_assoc_array,
        bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
        bintoken::token::code::int16, 0x7F, 0x00,
        bintoken::token::code::end_assoc_array,
        bintoken::token::code::null,
        bintoken::token::code::end_array
    };
    auto result = bintoken::parse(input);
    TRIAL_PROTOCOL_TEST(result.is<array>());
    const auto expected = array::make({ true, map::make({ "ABC", 127 }), null });
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected.begin(), expected.end(),
                                 std::equal_to<decltype(expected)>());
}